

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int setup_traffic_protection
              (ptls_t *tls,int is_enc,char *secret_label,size_t epoch,uint64_t seq,int skip_notify)

{
  char *type;
  int iVar1;
  ptls_aead_context_t *ppVar2;
  ptls_iovec_t secret;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_68;
  int ret;
  st_ptls_traffic_protection_t *ctx;
  int skip_notify_local;
  uint64_t seq_local;
  size_t epoch_local;
  char *secret_label_local;
  int is_enc_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_68 = &tls->traffic_protection;
  }
  else {
    local_68 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  if ((secret_label == (char *)0x0) ||
     (tls_local._4_4_ = derive_secret(tls->key_schedule,local_68,secret_label), tls_local._4_4_ == 0
     )) {
    (local_68->dec).epoch = epoch;
    iVar1 = ptls_is_server(tls);
    type = setup_traffic_protection::log_labels[(int)(uint)(iVar1 == is_enc)][epoch];
    secret = ptls_iovec_init(local_68,(tls->key_schedule->hashes[0].algo)->digest_size);
    log_secret(tls,type,secret);
    if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
      if ((local_68->dec).aead != (ptls_aead_context_t *)0x0) {
        ptls_aead_free((local_68->dec).aead);
      }
      ppVar2 = ptls_aead_new(tls->cipher_suite->aead,tls->cipher_suite->hash,is_enc,local_68,
                             tls->ctx->hkdf_label_prefix__obsolete);
      (local_68->dec).aead = ppVar2;
      if (ppVar2 == (ptls_aead_context_t *)0x0) {
        tls_local._4_4_ = 0x201;
      }
      else {
        (local_68->dec).seq = seq;
        tls_local._4_4_ = 0;
      }
    }
    else if (skip_notify == 0) {
      tls_local._4_4_ =
           (*tls->ctx->update_traffic_key->cb)
                     (tls->ctx->update_traffic_key,tls,is_enc,epoch,local_68);
    }
    else {
      tls_local._4_4_ = 0;
    }
  }
  return tls_local._4_4_;
}

Assistant:

static int setup_traffic_protection(ptls_t *tls, int is_enc, const char *secret_label, size_t epoch, uint64_t seq, int skip_notify)
{
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if (secret_label != NULL) {
        int ret;
        if ((ret = derive_secret(tls->key_schedule, ctx->secret, secret_label)) != 0)
            return ret;
    }

    ctx->epoch = epoch;

    log_secret(tls, log_labels[ptls_is_server(tls) == is_enc][epoch],
               ptls_iovec_init(ctx->secret, tls->key_schedule->hashes[0].algo->digest_size));

    /* special path for applications having their own record layer */
    if (tls->ctx->update_traffic_key != NULL) {
        if (skip_notify)
            return 0;
        return tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, is_enc, epoch, ctx->secret);
    }

    if (ctx->aead != NULL)
        ptls_aead_free(ctx->aead);
    if ((ctx->aead = ptls_aead_new(tls->cipher_suite->aead, tls->cipher_suite->hash, is_enc, ctx->secret,
                                   tls->ctx->hkdf_label_prefix__obsolete)) == NULL)
        return PTLS_ERROR_NO_MEMORY; /* TODO obtain error from ptls_aead_new */
    ctx->seq = seq;

#if defined(PTLS_DEBUG) && PTLS_DEBUG
    {
        uint8_t static_iv[PTLS_MAX_IV_SIZE];
        ptls_aead_get_iv(ctx->aead, static_iv);
        PTLS_DEBUGF("[%s] %02x%02x,%02x%02x\n", log_labels[ptls_is_server(tls)][epoch], (unsigned)ctx->secret[0],
                    (unsigned)ctx->secret[1], static_iv[0], static_iv[1]);
    }
#endif

    return 0;
}